

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  pointer ppTVar2;
  pointer piVar3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  pointer ppTVar10;
  long lVar11;
  TestPartResult *pTVar12;
  long lVar13;
  ostream *poVar14;
  int iVar15;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  pointer ppEVar16;
  int iVar17;
  TestEventRepeater *pTVar18;
  ulong uVar19;
  pointer ppEVar20;
  TestSuite *this_00;
  TestResult *this_01;
  undefined1 local_70 [32];
  TestEventRepeater *local_50;
  int local_48;
  int local_44;
  undefined8 local_40;
  allocator<char> local_32;
  byte local_31;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_70,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&g_argvs_abi_cxx11_);
  uVar4 = local_70._0_8_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_70);
  bVar6 = 1;
  if (g_help_flag != '\0') goto LAB_001526f4;
  PostFlagParsingInit(this);
  WriteToShardStatusFileIfNeeded();
  pIVar1 = (this->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  bVar5 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                      pIVar1 != (InternalRunDeathTestFlag *)0x0);
  local_48 = FilterTests(this,(uint)!bVar5);
  if (FLAGS_gtest_list_tests == '\x01') {
    ListTestsMatchingFilter(this);
    bVar6 = 1;
    goto LAB_001526f4;
  }
  iVar15 = 0;
  if (FLAGS_gtest_shuffle == '\x01') {
    iVar15 = FLAGS_gtest_random_seed;
    if (FLAGS_gtest_random_seed == 0) {
      lVar9 = std::chrono::_V2::system_clock::now();
      iVar15 = (int)(SUB168(SEXT816(lVar9) * SEXT816(0x431bde82d7b634db),8) >> 0x12) -
               (SUB164(SEXT816(lVar9) * SEXT816(0x431bde82d7b634db),0xc) >> 0x1f);
    }
    iVar15 = (iVar15 - 1U) % 99999 + 1;
  }
  this->random_seed_ = iVar15;
  pTVar18 = (this->listeners_).repeater_;
  lVar9 = std::chrono::_V2::system_clock::now();
  this->start_timestamp_ = lVar9 / 1000000;
  (*(pTVar18->super_TestEventListener)._vptr_TestEventListener[2])(pTVar18,this->parent_);
  uVar7 = 1;
  if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
    uVar7 = FLAGS_gtest_repeat;
  }
  if (uVar7 != 0) {
    local_31 = (int)uVar7 < 0 | FLAGS_gtest_recreate_environments_when_repeating;
    local_44 = uVar7 - 1;
    local_40 = 0;
    uVar19 = 0;
    local_50 = pTVar18;
LAB_00152201:
    pTVar18 = local_50;
    ppTVar2 = (this->test_suites_).
              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar10 = (this->test_suites_).
                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppTVar10 != ppTVar2;
        ppTVar10 = ppTVar10 + 1) {
      TestSuite::ClearResult(*ppTVar10);
    }
    lVar9 = std::chrono::_V2::steady_clock::now();
    iVar15 = (int)uVar19;
    if (0 < local_48) {
      if (FLAGS_gtest_shuffle == '\x01') {
        (this->random_).state_ = this->random_seed_;
        ShuffleTests(this);
      }
      (*(pTVar18->super_TestEventListener)._vptr_TestEventListener[3])(pTVar18,this->parent_,uVar19)
      ;
      if (iVar15 == 0 || (local_31 & 1) != 0) {
        (*(pTVar18->super_TestEventListener)._vptr_TestEventListener[4])(pTVar18,this->parent_);
        ppEVar16 = (this->environments_).
                   super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        for (ppEVar20 = (this->environments_).
                        super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppEVar20 != ppEVar16;
            ppEVar20 = ppEVar20 + 1) {
          (**(code **)(*(long *)*ppEVar20 + 0x10))();
        }
        (*(pTVar18->super_TestEventListener)._vptr_TestEventListener[5])(pTVar18,this->parent_);
      }
      bVar5 = Test::IsSkipped();
      if (bVar5) {
        UnitTest::GetInstance();
        if ((UnitTest::GetInstance::instance.impl_)->current_test_info_ == (TestInfo *)0x0) {
          if ((UnitTest::GetInstance::instance.impl_)->current_test_suite_ == (TestSuite *)0x0) {
            this_01 = &(UnitTest::GetInstance::instance.impl_)->ad_hoc_test_result_;
          }
          else {
            this_01 = &(UnitTest::GetInstance::instance.impl_)->current_test_suite_->
                       ad_hoc_test_result_;
          }
        }
        else {
          this_01 = &(UnitTest::GetInstance::instance.impl_)->current_test_info_->result_;
        }
        if (0 < (int)((ulong)((long)(this_01->test_part_results_).
                                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_01->test_part_results_).
                                   super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
          iVar17 = 0;
          do {
            pTVar12 = TestResult::GetTestPartResult(this_01,iVar17);
            if (pTVar12->type_ == kSkip) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_70,(pTVar12->message_)._M_dataplus._M_p,&local_32);
              puts((char *)local_70._0_8_);
              if ((pointer)local_70._0_8_ != (pointer)(local_70 + 0x10)) {
                operator_delete((void *)local_70._0_8_,
                                (ulong)((long)&((_Alloc_hider *)local_70._16_8_)->_M_p + 1));
              }
            }
            iVar17 = iVar17 + 1;
            iVar8 = (int)((ulong)((long)(this_01->test_part_results_).
                                        super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_01->test_part_results_).
                                       super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
          } while (SBORROW4(iVar17,iVar8 * -0x49249249) != iVar17 + iVar8 * 0x49249249 < 0);
        }
        fflush(_stdout);
        pTVar18 = local_50;
      }
      else {
        bVar5 = Test::HasFatalFailure();
        if (bVar5) {
          bVar5 = Test::HasFatalFailure();
          if ((bVar5) &&
             (ppTVar10 = (this->test_suites_).
                         super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
             0 < (int)((ulong)((long)(this->test_suites_).
                                     super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar10) >>
                      3))) {
            lVar13 = 0;
            do {
              TestSuite::Skip(ppTVar10[(uint)(this->test_suite_indices_).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[lVar13]]);
              lVar13 = lVar13 + 1;
              ppTVar10 = (this->test_suites_).
                         super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
            } while (lVar13 < (int)((ulong)((long)(this->test_suites_).
                                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)ppTVar10) >> 3));
          }
        }
        else {
          ppTVar10 = (this->test_suites_).
                     super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)((ulong)((long)(this->test_suites_).
                                      super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar10)
                       >> 3)) {
            lVar13 = 1;
            do {
              TestSuite::Run(ppTVar10[(uint)(this->test_suite_indices_).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start[lVar13 + -1]]);
              if (FLAGS_gtest_fail_fast == '\x01') {
                piVar3 = (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                if ((lVar13 + -1 <
                     (long)(int)((ulong)((long)(this->test_suite_indices_).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_finish - (long)piVar3) >>
                                2)) && (lVar11 = (long)piVar3[lVar13 + -1], -1 < lVar11)) {
                  this_00 = (this->test_suites_).
                            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar11];
                }
                else {
                  this_00 = (TestSuite *)0x0;
                }
                iVar17 = TestSuite::failed_test_count(this_00);
                if ((0 < iVar17) ||
                   (bVar5 = TestResult::Failed(&this_00->ad_hoc_test_result_), bVar5))
                goto LAB_0015244a;
              }
              ppTVar10 = (this->test_suites_).
                         super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              bVar5 = lVar13 < (int)((ulong)((long)(this->test_suites_).
                                                                                                      
                                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)ppTVar10) >> 3);
              lVar13 = lVar13 + 1;
            } while (bVar5);
          }
        }
      }
      goto LAB_00152510;
    }
    (*(pTVar18->super_TestEventListener)._vptr_TestEventListener[3])(pTVar18,this->parent_,uVar19);
    goto LAB_0015255e;
  }
  bVar6 = 1;
  goto LAB_001526ca;
LAB_0015244a:
  for (; ppTVar10 = (this->test_suites_).
                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
      (int)lVar13 <
      (int)((ulong)((long)(this->test_suites_).
                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar10) >> 3);
      lVar13 = lVar13 + 1) {
    TestSuite::Skip(ppTVar10[(uint)(this->test_suite_indices_).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar13]]);
  }
LAB_00152510:
  if (iVar15 == local_44 || (local_31 & 1) != 0) {
    (*(pTVar18->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar18,this->parent_);
    ppEVar20 = (this->environments_).
               super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    for (ppEVar16 = (this->environments_).
                    super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish; ppEVar16 != ppEVar20;
        ppEVar16 = ppEVar16 + -1) {
      (**(code **)(*(long *)ppEVar16[-1] + 0x18))();
    }
    (*(pTVar18->super_TestEventListener)._vptr_TestEventListener[0xf])(pTVar18,this->parent_);
  }
LAB_0015255e:
  lVar13 = std::chrono::_V2::steady_clock::now();
  this->elapsed_time_ = (lVar13 - lVar9) / 1000000;
  (*(pTVar18->super_TestEventListener)._vptr_TestEventListener[0x10])(pTVar18,this->parent_,uVar19);
  bVar5 = Passed(this);
  UnshuffleTests(this);
  if (FLAGS_gtest_shuffle == '\x01') {
    iVar17 = this->random_seed_;
    if (0x1869e < iVar17 - 1U) {
      GTestLog::GTestLog((GTestLog *)local_70,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/extern/googletest/googletest/src/gtest-internal-inl.h"
                         ,0x80);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition 1 <= seed && seed <= kMaxRandomSeed failed. ",0x36
                );
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Invalid random seed ",0x14);
      poVar14 = (ostream *)std::ostream::operator<<(&std::cerr,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," - must be in [1, ",0x12);
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,99999);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"].",2);
      GTestLog::~GTestLog((GTestLog *)local_70);
    }
    iVar8 = iVar17 + 1;
    if (0x1869e < iVar17) {
      iVar8 = 1;
    }
    this->random_seed_ = iVar8;
  }
  bVar6 = (byte)local_40 | !bVar5;
  local_40 = CONCAT71((int7)((ulong)local_40 >> 8),bVar6);
  uVar19 = (ulong)(iVar15 + 1U);
  if (iVar15 + 1U == uVar7 && -1 < (int)uVar7) goto code_r0x001526b9;
  goto LAB_00152201;
code_r0x001526b9:
  bVar6 = bVar6 ^ 1;
  pTVar18 = local_50;
LAB_001526ca:
  (*(pTVar18->super_TestEventListener)._vptr_TestEventListener[0x11])(pTVar18,this->parent_);
  if (local_70._8_8_ == uVar4) {
    ColoredPrintf(kRed,
                  "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                 );
  }
LAB_001526f4:
  return (bool)(bVar6 & 1);
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test =
      (internal_run_death_test_flag_.get() != nullptr);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG_GET(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG_GET(shuffle)
                     ? GetRandomSeedFromFlag(GTEST_FLAG_GET(random_seed))
                     : 0;

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG_GET(repeat);

  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;

  // Should test environments be set up and torn down for each repeat, or only
  // set up on the first and torn down on the last iteration? If there is no
  // "last" iteration because the tests will repeat forever, always recreate the
  // environments to avoid leaks in case one of the environments is using
  // resources that are external to this process. Without this check there would
  // be no way to clean up those external resources automatically.
  const bool recreate_environments_when_repeating =
      GTEST_FLAG_GET(recreate_environments_when_repeating) ||
      gtest_repeat_forever;

  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    Timer timer;

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG_GET(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand. If test environments aren't
      // recreated for each iteration, only do so on the first iteration.
      if (i == 0 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsSetUpStart(*parent_);
        ForEach(environments_, SetUpEnvironment);
        repeater->OnEnvironmentsSetUpEnd(*parent_);
      }

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG_GET(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      } else if (Test::HasFatalFailure()) {
        // If there was a fatal failure during the global setup then we know we
        // aren't going to run any tests. Explicitly mark all of the tests as
        // skipped to make this obvious in the output.
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Skip();
        }
      }

      // Tears down all environments in reverse order afterwards. If test
      // environments aren't recreated for each iteration, only do so on the
      // last iteration.
      if (i == repeat - 1 || recreate_environments_when_repeating) {
        repeater->OnEnvironmentsTearDownStart(*parent_);
        std::for_each(environments_.rbegin(), environments_.rend(),
                      TearDownEnvironment);
        repeater->OnEnvironmentsTearDownEnd(*parent_);
      }
    }

    elapsed_time_ = timer.Elapsed();

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG_GET(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(GTestColor::kRed,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}